

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reset.cpp
# Opt level: O2

void RequireValueEqual(ConfigurationOption *op,Value *left,Value *right,int line)

{
  char *pcVar1;
  char cVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  string error;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  SourceLineInfo local_30;
  
  cVar2 = duckdb::Value::NotDistinctFrom(left,right);
  if (cVar2 == '\0') {
    std::__cxx11::string::string
              (local_c8,"\nLINE[%d] (Option:%s) | Expected left:\'%s\' and right:\'%s\' to be equal"
               ,(allocator *)&catchAssertionHandler);
    pcVar1 = op->name;
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::StringUtil::Format<int,char_const*,std::__cxx11::string,std::__cxx11::string>
              (&error,(StringUtil *)local_c8,(string *)(ulong)(uint)line,(int)pcVar1,
               (char *)local_e8,&local_108,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&error);
    std::endl<char,std::char_traits<char>>(poVar3);
    local_30.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_reset.cpp"
    ;
    local_30.line = 0xbb;
    Catch::StringRef::StringRef(&local_40,"false");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&stack0xfffffffffffffee8,&local_30,local_40,
               Normal);
    Catch::AssertionHandler::handleExpr<bool>
              (&catchAssertionHandler,(ExprLhs<bool> *)&stack0xfffffffffffffee8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&error);
  }
  return;
}

Assistant:

void RequireValueEqual(const ConfigurationOption &op, const Value &left, const Value &right, int line) {
	if (ValueEqual(left, right)) {
		return;
	}
	auto error = StringUtil::Format("\nLINE[%d] (Option:%s) | Expected left:'%s' and right:'%s' to be equal", line,
	                                op.name, left.ToString(), right.ToString());
	cerr << error << endl;
	REQUIRE(false);
}